

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format(string *__return_storage_ptr__,string *fmt,string *arg1,int arg2)

{
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_25;
  int local_24;
  string *psStack_20;
  int arg2_local;
  string *arg1_local;
  string *fmt_local;
  string *output;
  
  local_25 = 0;
  local_24 = arg2;
  psStack_20 = arg1;
  arg1_local = fmt;
  fmt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"{1}",&local_49);
  replace_positional(__return_storage_ptr__,&local_48,psStack_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"{2}",&local_81);
  format_abi_cxx11_(&local_a8,local_24);
  replace_positional(__return_storage_ptr__,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  const std::string& arg1,
  int arg2)
{
  std::string output = fmt;
  replace_positional (output, "{1}", arg1);
  replace_positional (output, "{2}", format (arg2));
  return output;
}